

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

void http2_stream_free(HTTP *http)

{
  size_t sVar1;
  
  if (http != (HTTP *)0x0) {
    Curl_dyn_free(&http->header_recvbuf);
    sVar1 = http->push_headers_used;
    while( true ) {
      if (sVar1 == 0) break;
      (*Curl_cfree)(http->push_headers[sVar1 - 1]);
      sVar1 = http->push_headers_used - 1;
      http->push_headers_used = sVar1;
    }
    (*Curl_cfree)(http->push_headers);
    http->push_headers = (char **)0x0;
  }
  return;
}

Assistant:

static void http2_stream_free(struct HTTP *http)
{
  if(http) {
    Curl_dyn_free(&http->header_recvbuf);
    for(; http->push_headers_used > 0; --http->push_headers_used) {
      free(http->push_headers[http->push_headers_used - 1]);
    }
    free(http->push_headers);
    http->push_headers = NULL;
  }
}